

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalSetOperation::Serialize(LogicalSetOperation *this,Serializer *serializer)

{
  bool local_1a;
  bool local_19;
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,200,"table_index",&this->table_index);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xc9,"column_count",&this->column_count);
  local_19 = true;
  Serializer::WritePropertyWithDefault<bool>(serializer,0xca,"setop_all",&this->setop_all,&local_19)
  ;
  local_1a = true;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xcb,"allow_out_of_order",&this->allow_out_of_order,&local_1a);
  return;
}

Assistant:

void LogicalSetOperation::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<idx_t>(200, "table_index", table_index);
	serializer.WritePropertyWithDefault<idx_t>(201, "column_count", column_count);
	serializer.WritePropertyWithDefault<bool>(202, "setop_all", setop_all, true);
	serializer.WritePropertyWithDefault<bool>(203, "allow_out_of_order", allow_out_of_order, true);
}